

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.h
# Opt level: O2

bool __thiscall
Clasp::Solver::updateOnReason(Solver *this,ConstraintScore *sc,Literal p,LitVec *lits)

{
  Literal *first;
  uint uVar1;
  uint32 uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  pair<Clasp::Literal,_int> local_38;
  
  if (&this->conflict_ == lits) {
    uVar1 = sc->rep;
    if ((~uVar1 & 0xfffff) != 0) {
      uVar1 = uVar1 + 1;
      sc->rep = uVar1;
    }
    uVar5 = SUB84(this->strategy_,4) >> 7 & 3;
    if ((uVar5 != 0) && (uVar3 = (ulong)(lits->ebo_).size, uVar3 != 0)) {
      uVar4 = uVar1 >> 0x14 & 0x7f;
      if ((uVar1 & 0x7f00000) == 0) {
        uVar4 = 0x7f;
      }
      first = (lits->ebo_).buf;
      uVar2 = countLevels(this,first,first + uVar3,uVar4 - (uVar5 != 1));
      if ((uVar5 != 1) + uVar2 < uVar4) {
        ConstraintScore::bumpLbd(sc,uVar2 + (uVar5 == 3));
      }
    }
    if ((((this->strategy_).field_0x6 & 4) != 0) &&
       ((byte)(*(byte *)((long)(this->assign_).assign_.ebo_.buf + (ulong)(p.rep_ & 0xfffffffc)) & 3)
        == (byte)(2U - ((p.rep_ & 2) == 0)))) {
      local_38.second = sc->rep >> 0x14 & 0x7f;
      if ((sc->rep & 0x7f00000) == 0) {
        local_38.second = 0x7f;
      }
      local_38.first.rep_ = p.rep_;
      bk_lib::
      pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
      push_back(&this->bumpAct_,&local_38);
    }
  }
  return &this->conflict_ == lits;
}

Assistant:

bool updateOnReason(ConstraintScore& sc, Literal p, const LitVec& lits) {
		// update only during conflict resolution
		if (&lits != &conflict_) { return false; }
		sc.bumpActivity();
		uint32 up = strategy_.updateLbd;
		if (up != SolverStrategies::lbd_fixed && !lits.empty()) {
			uint32 lbd  = sc.lbd();
			uint32 inc  = uint32(up != SolverStrategies::lbd_updated_less);
			uint32 nLbd = countLevels(&lits[0], &lits[0] + lits.size(), lbd - inc);
			if ((nLbd + inc) < lbd) {
				sc.bumpLbd(nLbd + uint32(up == SolverStrategies::lbd_update_pseudo));
			}
		}
		if (strategy_.bumpVarAct && isTrue(p)) { bumpAct_.push_back(WeightLiteral(p, sc.lbd())); }
		return true;
	}